

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AnalysisLoad(sqlite3 *db,int iDb)

{
  Schema *pSVar1;
  Table *pTVar2;
  char *zSql_00;
  Index *pIdx_1;
  Index *pIdx;
  Table *pTab;
  Table *pStat1;
  Schema *pSchema;
  int rc;
  char *zSql;
  HashElem *i;
  analysisInfo sInfo;
  int iDb_local;
  sqlite3 *db_local;
  
  pSchema._4_4_ = 0;
  pSVar1 = db->aDb[iDb].pSchema;
  for (zSql = (char *)(pSVar1->tblHash).first; zSql != (char *)0x0; zSql = *(char **)zSql) {
    *(uint *)(*(long *)(zSql + 0x10) + 0x30) = *(uint *)(*(long *)(zSql + 0x10) + 0x30) & 0xffffffef
    ;
  }
  for (zSql = (char *)(pSVar1->idxHash).first; zSql != (char *)0x0; zSql = *(char **)zSql) {
    *(ushort *)(*(long *)(zSql + 0x10) + 99) = *(ushort *)(*(long *)(zSql + 0x10) + 99) & 0xff7f;
  }
  sInfo.db = (sqlite3 *)db->aDb[iDb].zDbSName;
  i = (HashElem *)db;
  sInfo.zDatabase._4_4_ = iDb;
  pTVar2 = sqlite3FindTable(db,"sqlite_stat1",(char *)sInfo.db);
  if ((pTVar2 != (Table *)0x0) && (pTVar2->eTabType == '\0')) {
    zSql_00 = sqlite3MPrintf(db,"SELECT tbl,idx,stat FROM %Q.sqlite_stat1",sInfo.db);
    if (zSql_00 == (char *)0x0) {
      pSchema._4_4_ = 7;
    }
    else {
      pSchema._4_4_ = sqlite3_exec(db,zSql_00,analysisLoader,&i,(char **)0x0);
      sqlite3DbFree(db,zSql_00);
    }
  }
  for (zSql = (char *)(pSVar1->idxHash).first; zSql != (char *)0x0; zSql = *(char **)zSql) {
    if ((*(ushort *)&(*(Index **)(zSql + 0x10))->field_0x63 >> 7 & 1) == 0) {
      sqlite3DefaultRowEst(*(Index **)(zSql + 0x10));
    }
  }
  if (pSchema._4_4_ == 7) {
    sqlite3OomFault(db);
  }
  return pSchema._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3AnalysisLoad(sqlite3 *db, int iDb){
  analysisInfo sInfo;
  HashElem *i;
  char *zSql;
  int rc = SQLITE_OK;
  Schema *pSchema = db->aDb[iDb].pSchema;
  const Table *pStat1;

  assert( iDb>=0 && iDb<db->nDb );
  assert( db->aDb[iDb].pBt!=0 );

  /* Clear any prior statistics */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->tblHash); i; i=sqliteHashNext(i)){
    Table *pTab = sqliteHashData(i);
    pTab->tabFlags &= ~TF_HasStat1;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    pIdx->hasStat1 = 0;
#ifdef SQLITE_ENABLE_STAT4
    sqlite3DeleteIndexSamples(db, pIdx);
    pIdx->aSample = 0;
#endif
  }

  /* Load new statistics out of the sqlite_stat1 table */
  sInfo.db = db;
  sInfo.zDatabase = db->aDb[iDb].zDbSName;
  if( (pStat1 = sqlite3FindTable(db, "sqlite_stat1", sInfo.zDatabase))
   && IsOrdinaryTable(pStat1)
  ){
    zSql = sqlite3MPrintf(db,
        "SELECT tbl,idx,stat FROM %Q.sqlite_stat1", sInfo.zDatabase);
    if( zSql==0 ){
      rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3_exec(db, zSql, analysisLoader, &sInfo, 0);
      sqlite3DbFree(db, zSql);
    }
  }

  /* Set appropriate defaults on all indexes not in the sqlite_stat1 table */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    if( !pIdx->hasStat1 ) sqlite3DefaultRowEst(pIdx);
  }

  /* Load the statistics from the sqlite_stat4 table. */
#ifdef SQLITE_ENABLE_STAT4
  if( rc==SQLITE_OK ){
    DisableLookaside;
    rc = loadStat4(db, sInfo.zDatabase);
    EnableLookaside;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    sqlite3_free(pIdx->aiRowEst);
    pIdx->aiRowEst = 0;
  }
#endif

  if( rc==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
  return rc;
}